

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr
          (ExceptionOr<kj::Maybe<kj::OwnFd>_> *this,Maybe<kj::OwnFd> *value)

{
  Maybe<kj::OwnFd> *t;
  Maybe<kj::OwnFd> *value_local;
  ExceptionOr<kj::Maybe<kj::OwnFd>_> *this_local;
  
  ExceptionOrValue::ExceptionOrValue(&this->super_ExceptionOrValue);
  t = mv<kj::Maybe<kj::OwnFd>>(value);
  Maybe<kj::Maybe<kj::OwnFd>_>::Maybe(&this->value,t);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}